

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_branch(TCGContext_conflict9 *s,int call,tcg_insn_unit *dest)

{
  tcg_insn_unit *ptVar1;
  TCGLabelPoolData *pTVar2;
  TCGLabelPoolData *pTVar3;
  int *piVar4;
  TCGLabelPoolData *pTVar5;
  TCGLabelPoolData *pTVar6;
  TCGLabelPoolData *pTVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  ptVar1 = s->code_ptr;
  if (((long)dest - (long)ptVar1) + 0x7ffffffbU >> 0x20 == 0) {
    iVar10 = (int)((long)dest - (long)ptVar1) + -5;
    tcg_out_opc(s,(call == 0) + 0xe8,0,0,0);
  }
  else {
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xff;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = (call == 0) * '\x10' + '\x15';
    pTVar6 = (TCGLabelPoolData *)s->pool_cur;
    ptVar1 = s->code_ptr;
    if (s->pool_end < &pTVar6[1].label) {
      pTVar6 = (TCGLabelPoolData *)tcg_malloc_internal_tricore(s,0x28);
    }
    else {
      s->pool_cur = (uint8_t *)&pTVar6[1].label;
    }
    pTVar6->label = ptVar1;
    pTVar6->addend = -4;
    pTVar6->rtype = 2;
    pTVar6->nlong = 1;
    pTVar6[1].next = (TCGLabelPoolData *)dest;
    iVar10 = 0;
    pTVar5 = (TCGLabelPoolData *)&s->pool_labels;
    for (pTVar7 = s->pool_labels; pTVar7 != (TCGLabelPoolData *)0x0; pTVar7 = pTVar7->next) {
      if (pTVar7->nlong == 1) {
        pTVar2 = pTVar6[1].next;
        pTVar3 = pTVar7[1].next;
        uVar8 = (ulong)pTVar2 >> 0x38 | ((ulong)pTVar2 & 0xff000000000000) >> 0x28 |
                ((ulong)pTVar2 & 0xff0000000000) >> 0x18 | ((ulong)pTVar2 & 0xff00000000) >> 8 |
                ((ulong)pTVar2 & 0xff000000) << 8 | ((ulong)pTVar2 & 0xff0000) << 0x18 |
                ((ulong)pTVar2 & 0xff00) << 0x28 | (long)pTVar2 << 0x38;
        uVar9 = (ulong)pTVar3 >> 0x38 | ((ulong)pTVar3 & 0xff000000000000) >> 0x28 |
                ((ulong)pTVar3 & 0xff0000000000) >> 0x18 | ((ulong)pTVar3 & 0xff00000000) >> 8 |
                ((ulong)pTVar3 & 0xff000000) << 8 | ((ulong)pTVar3 & 0xff0000) << 0x18 |
                ((ulong)pTVar3 & 0xff00) << 0x28 | (long)pTVar3 << 0x38;
        if (-1 < (int)((uint)(uVar9 < uVar8) - (uint)(uVar8 < uVar9))) goto LAB_00d06218;
      }
      else if (pTVar7->nlong == 0) goto LAB_00d06218;
      pTVar5 = pTVar7;
    }
    pTVar7 = (TCGLabelPoolData *)0x0;
LAB_00d06218:
    pTVar6->next = pTVar7;
    pTVar5->next = pTVar6;
  }
  piVar4 = (int *)s->code_ptr;
  *piVar4 = iVar10;
  s->code_ptr = (tcg_insn_unit *)(piVar4 + 1);
  return;
}

Assistant:

static void tcg_out_branch(TCGContext *s, int call, tcg_insn_unit *dest)
{
    intptr_t disp = tcg_pcrel_diff(s, dest) - 5;

    if (disp == (int32_t)disp) {
        tcg_out_opc(s, call ? OPC_CALL_Jz : OPC_JMP_long, 0, 0, 0);
        tcg_out32(s, disp);
    } else {
        /* rip-relative addressing into the constant pool.
           This is 6 + 8 = 14 bytes, as compared to using an
           an immediate load 10 + 6 = 16 bytes, plus we may
           be able to re-use the pool constant for more calls.  */
        tcg_out_opc(s, OPC_GRP5, 0, 0, 0);
        tcg_out8(s, (call ? EXT5_CALLN_Ev : EXT5_JMPN_Ev) << 3 | 5);
        new_pool_label(s, (uintptr_t)dest, R_386_PC32, s->code_ptr, -4);
        tcg_out32(s, 0);
    }
}